

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O1

Aig_Man_t * Aig_ManDupRepr(Aig_Man_t *p,int fOrdered)

{
  char *pcVar1;
  Vec_Int_t *pVVar2;
  void *pvVar3;
  Aig_Obj_t **ppAVar4;
  int iVar5;
  Aig_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  int *__dest;
  Aig_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pName = pcVar7;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p_00->pSpec = pcVar7;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  pVVar2 = p->vFlopNums;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    pVVar8 = (Vec_Int_t *)malloc(0x10);
    iVar5 = pVVar2->nSize;
    lVar13 = (long)iVar5;
    pVVar8->nSize = iVar5;
    pVVar8->nCap = iVar5;
    if (lVar13 == 0) {
      __dest = (int *)0x0;
    }
    else {
      __dest = (int *)malloc(lVar13 * 4);
    }
    pVVar8->pArray = __dest;
    memcpy(__dest,pVVar2->pArray,lVar13 << 2);
    p_00->vFlopNums = pVVar8;
  }
  Aig_ManCleanData(p);
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar13];
      pAVar9 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar9;
      lVar13 = lVar13 + 1;
      pVVar10 = p->vCis;
    } while (lVar13 < pVVar10->nSize);
  }
  if (fOrdered == 0) {
    pVVar10 = p->vCos;
    if (0 < pVVar10->nSize) {
      lVar13 = 0;
      do {
        Aig_ManDupRepr_rec(p_00,p,(Aig_Obj_t *)
                                  (*(ulong *)((long)pVVar10->pArray[lVar13] + 8) &
                                  0xfffffffffffffffe));
        lVar13 = lVar13 + 1;
        pVVar10 = p->vCos;
      } while (lVar13 < pVVar10->nSize);
    }
  }
  else {
    pVVar10 = p->vObjs;
    if (0 < pVVar10->nSize) {
      lVar13 = 0;
      do {
        pvVar3 = pVVar10->pArray[lVar13];
        if ((pvVar3 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar3 + 0x18) & 7) - 7)) {
          ppAVar4 = p->pReprs;
          if (ppAVar4 == (Aig_Obj_t **)0x0) goto LAB_006c3ad6;
          uVar11 = *(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe;
          if (p->nReprsAlloc <= *(int *)(uVar11 + 0x24)) goto LAB_006c3ab7;
          pAVar9 = ppAVar4[*(int *)(uVar11 + 0x24)];
          if (pAVar9 == (Aig_Obj_t *)0x0) {
            uVar11 = *(ulong *)(uVar11 + 0x28);
          }
          else {
            uVar11 = (ulong)((*(uint *)&pAVar9->field_0x18 ^ *(uint *)(uVar11 + 0x18)) >> 3 & 1) ^
                     (ulong)(pAVar9->field_5).pData;
          }
          uVar12 = *(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe;
          if (p->nReprsAlloc <= *(int *)(uVar12 + 0x24)) goto LAB_006c3ab7;
          pAVar9 = ppAVar4[*(int *)(uVar12 + 0x24)];
          if (pAVar9 == (Aig_Obj_t *)0x0) {
            uVar12 = *(ulong *)(uVar12 + 0x28);
          }
          else {
            uVar12 = (ulong)((*(uint *)&pAVar9->field_0x18 ^ *(uint *)(uVar12 + 0x18)) >> 3 & 1) ^
                     (ulong)(pAVar9->field_5).pData;
          }
          pAVar9 = Aig_And(p_00,(Aig_Obj_t *)(uVar11 ^ (uint)*(ulong *)((long)pvVar3 + 8) & 1),
                           (Aig_Obj_t *)((uint)*(ulong *)((long)pvVar3 + 0x10) & 1 ^ uVar12));
          *(Aig_Obj_t **)((long)pvVar3 + 0x28) = pAVar9;
        }
        lVar13 = lVar13 + 1;
        pVVar10 = p->vObjs;
      } while (lVar13 < pVVar10->nSize);
    }
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar13 = 0;
    do {
      if (p->pReprs == (Aig_Obj_t **)0x0) {
LAB_006c3ad6:
        __assert_fail("p->pReprs != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                      ,0x85,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar11 = *(ulong *)((long)pVVar10->pArray[lVar13] + 8);
      uVar12 = uVar11 & 0xfffffffffffffffe;
      if (p->nReprsAlloc <= *(int *)(uVar12 + 0x24)) {
LAB_006c3ab7:
        __assert_fail("pNode->Id < p->nReprsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigRepr.c"
                      ,0x87,"Aig_Obj_t *Aig_ObjFindRepr(Aig_Man_t *, Aig_Obj_t *)");
      }
      pAVar9 = p->pReprs[*(int *)(uVar12 + 0x24)];
      if (pAVar9 == (Aig_Obj_t *)0x0) {
        uVar12 = *(ulong *)(uVar12 + 0x28);
      }
      else {
        uVar12 = (ulong)((*(uint *)&pAVar9->field_0x18 ^ *(uint *)(uVar12 + 0x18)) >> 3 & 1) ^
                 (ulong)(pAVar9->field_5).pData;
      }
      Aig_ObjCreateCo(p_00,(Aig_Obj_t *)((uint)uVar11 & 1 ^ uVar12));
      lVar13 = lVar13 + 1;
      pVVar10 = p->vCos;
    } while (lVar13 < pVVar10->nSize);
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  iVar5 = Aig_ManCheck(p_00);
  if (iVar5 == 0) {
    puts("Aig_ManDupRepr: Check has failed.");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupRepr( Aig_Man_t * p, int fOrdered )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    // start the HOP package
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // map the const and primary inputs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi(pNew);
//    Aig_ManForEachCi( p, pObj, i )
//        pObj->pData = Aig_ObjGetRepr( p, pObj );
    // map the internal nodes
    if ( fOrdered )
    {
        Aig_ManForEachNode( p, pObj, i )
            pObj->pData = Aig_And( pNew, Aig_ObjChild0Repr(p, pObj), Aig_ObjChild1Repr(p, pObj) );
    }
    else
    {
//        Aig_ManForEachObj( p, pObj, i )
//            if ( p->pReprs[i] )
//                printf( "Substituting %d for %d.\n", p->pReprs[i]->Id, pObj->Id );

        Aig_ManForEachCo( p, pObj, i )
            Aig_ManDupRepr_rec( pNew, p, Aig_ObjFanin0(pObj) );
    }
    // transfer the POs
    Aig_ManForEachCo( p, pObj, i )
        Aig_ObjCreateCo( pNew, Aig_ObjChild0Repr(p, pObj) );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // check the new manager
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupRepr: Check has failed.\n" );
    return pNew;
}